

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode parse_connect_to_slist(Curl_easy *data,connectdata *conn,curl_slist *conn_to_host)

{
  int iVar1;
  size_t max;
  byte *pbVar2;
  ushort **ppuVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  uint uVar7;
  byte *__s;
  byte bVar8;
  char *pcVar9;
  char *pcVar10;
  byte *pbVar11;
  bool bVar12;
  char *local_38;
  
  if (conn_to_host == (curl_slist *)0x0) {
    return CURLE_OK;
  }
LAB_001241a0:
  pcVar10 = conn_to_host->data;
  if (*pcVar10 == ':') {
LAB_00124239:
    if (pcVar10[1] != ':') {
      pcVar6 = strchr(pcVar10 + 1,0x3a);
      if (pcVar6 != (char *)0x0) {
        local_38 = (char *)0x0;
        lVar5 = strtol(pcVar10 + 1,&local_38,10);
        if ((local_38 == pcVar6) && (lVar5 == conn->remote_port)) {
          pcVar10 = pcVar6 + 1;
          goto LAB_00124249;
        }
      }
      goto LAB_001243b7;
    }
    pcVar10 = pcVar10 + 2;
LAB_00124249:
    if (*pcVar10 == '\0') goto LAB_001243b7;
    pbVar2 = (byte *)(*Curl_cstrdup)(pcVar10);
    if (pbVar2 == (byte *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    __s = pbVar2;
    pbVar11 = pbVar2;
    if (*pbVar2 == 0x5b) {
      pbVar11 = pbVar2 + 1;
      bVar8 = pbVar2[1];
      __s = pbVar11;
      if (bVar8 != 0) {
        ppuVar3 = __ctype_b_loc();
        do {
          if (((((*ppuVar3)[bVar8] >> 0xc & 1) == 0) && (bVar8 != 0x2e)) && (bVar8 != 0x3a)) {
            if (bVar8 != 0x25) goto LAB_001244e2;
            bVar8 = __s[1];
            if (bVar8 - 0x32 == 0) {
              iVar1 = 0x35 - (uint)__s[2];
            }
            else {
              iVar1 = -(bVar8 - 0x32);
            }
            __s = __s + 1;
            if (iVar1 != 0) {
              Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
              bVar8 = *__s;
            }
            if (bVar8 != 0) {
              goto LAB_001244af;
            }
            break;
          }
          bVar8 = __s[1];
          __s = __s + 1;
        } while (bVar8 != 0);
      }
      goto LAB_001242c2;
    }
    goto LAB_001242d5;
  }
  bVar12 = (conn->bits).ipv6_ip != false;
  pcVar6 = "";
  pcVar9 = "";
  if (bVar12) {
    pcVar9 = "[";
  }
  if (bVar12) {
    pcVar6 = "]";
  }
  pcVar6 = curl_maprintf("%s%s%s",pcVar9,(conn->host).name,pcVar6);
  if (pcVar6 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  max = strlen(pcVar6);
  iVar1 = Curl_strncasecompare(pcVar10,pcVar6,max);
  (*Curl_cfree)(pcVar6);
  if ((iVar1 != 0) && (pcVar10[max] == ':')) {
    pcVar10 = pcVar10 + max;
    goto LAB_00124239;
  }
  goto LAB_001243b7;
  while( true ) {
    bVar8 = __s[1];
    __s = __s + 1;
    if (bVar8 == 0) break;
LAB_001244af:
    if (((((*ppuVar3)[bVar8] & 0x1400) == 0) && (1 < bVar8 - 0x2d)) &&
       ((bVar8 != 0x5f && (bVar8 != 0x7e)))) goto LAB_001244e2;
  }
LAB_001242c2:
  Curl_infof(data,"Invalid IPv6 address format\n");
LAB_001242d5:
  pcVar10 = strchr((char *)__s,0x3a);
  if (pcVar10 == (char *)0x0) {
LAB_001243f9:
    uVar4 = 0xffffffff;
LAB_001243fe:
    uVar7 = (uint)uVar4;
    pcVar10 = (*Curl_cstrdup)((char *)pbVar11);
    (*Curl_cfree)(pbVar2);
    if (pcVar10 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (*pcVar10 != '\0') {
      (conn->conn_to_host).rawalloc = pcVar10;
      (conn->conn_to_host).name = pcVar10;
      (conn->bits).conn_to_host = true;
      bVar8 = 0;
      Curl_infof(data,"Connecting to hostname: %s\n",pcVar10);
      goto LAB_001243d1;
    }
  }
  else {
    local_38 = (char *)0x0;
    *pcVar10 = '\0';
    if (pcVar10[1] == '\0') goto LAB_001243f9;
    uVar4 = strtol(pcVar10 + 1,&local_38,10);
    if (((local_38 == (char *)0x0) || (*local_38 == '\0')) && (uVar4 < 0x10000)) goto LAB_001243fe;
    Curl_infof(data,"No valid port number in connect to host string (%s)\n",pcVar10 + 1);
    (*Curl_cfree)(pbVar2);
LAB_001243b7:
    uVar7 = 0xffffffff;
    pcVar10 = (char *)0x0;
  }
  (conn->bits).conn_to_host = false;
  (*Curl_cfree)(pcVar10);
  bVar8 = 1;
LAB_001243d1:
  if (-1 < (int)uVar7) {
    conn->conn_to_port = uVar7;
    (conn->bits).conn_to_port = true;
    Curl_infof(data,"Connecting to port: %d\n",(ulong)uVar7);
    return CURLE_OK;
  }
  (conn->bits).conn_to_port = false;
  conn_to_host = conn_to_host->next;
  if (!(bool)(bVar8 & conn_to_host != (curl_slist *)0x0)) {
    return CURLE_OK;
  }
  goto LAB_001241a0;
LAB_001244e2:
  if (bVar8 != 0x5d) goto LAB_001242c2;
  *__s = 0;
  __s = __s + 1;
  goto LAB_001242d5;
}

Assistant:

static CURLcode parse_connect_to_slist(struct Curl_easy *data,
                                       struct connectdata *conn,
                                       struct curl_slist *conn_to_host)
{
  CURLcode result = CURLE_OK;
  char *host = NULL;
  int port = -1;

  while(conn_to_host && !host && port == -1) {
    result = parse_connect_to_string(data, conn, conn_to_host->data,
                                     &host, &port);
    if(result)
      return result;

    if(host && *host) {
      conn->conn_to_host.rawalloc = host;
      conn->conn_to_host.name = host;
      conn->bits.conn_to_host = TRUE;

      infof(data, "Connecting to hostname: %s\n", host);
    }
    else {
      /* no "connect to host" */
      conn->bits.conn_to_host = FALSE;
      Curl_safefree(host);
    }

    if(port >= 0) {
      conn->conn_to_port = port;
      conn->bits.conn_to_port = TRUE;
      infof(data, "Connecting to port: %d\n", port);
    }
    else {
      /* no "connect to port" */
      conn->bits.conn_to_port = FALSE;
      port = -1;
    }

    conn_to_host = conn_to_host->next;
  }

  return result;
}